

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istring.h
# Opt level: O2

void __thiscall wasm::EffectAnalyzer::InternalAnalyzer::visitLoop(InternalAnalyzer *this,Loop *curr)

{
  size_type sVar1;
  
  if ((*(long *)(curr + 0x18) != 0) &&
     (sVar1 = std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::erase(&(this->parent->breakTargets)._M_t,(key_type *)(curr + 0x10)), sVar1 != 0)) {
    this->parent->mayNotReturn = true;
  }
  return;
}

Assistant:

explicit operator bool() const { return str.data() != nullptr; }